

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O0

string * __thiscall
Progress::formatTime_abi_cxx11_(string *__return_storage_ptr__,Progress *this,time_t t)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_b9;
  undefined4 local_b8;
  undefined4 local_b4;
  int seconds;
  int minutes;
  int hours;
  int days;
  char buffer [128];
  time_t t_local;
  Progress *this_local;
  
  minutes = (int)(t / 0x15180);
  uVar1 = (t % 0x15180) / 0xe10;
  seconds = (int)uVar1;
  uVar2 = (t % 0xe10) / 0x3c;
  local_b4 = (undefined4)uVar2;
  uVar3 = t % 0x3c;
  local_b8 = (undefined4)uVar3;
  if (minutes == 0) {
    if (seconds == 0) {
      snprintf((char *)&hours,0x80,"%02d:%02d",uVar2 & 0xffffffff,uVar3 & 0xffffffff);
    }
    else {
      snprintf((char *)&hours,0x80,"%d:%02d:%02d",uVar1 & 0xffffffff,uVar2 & 0xffffffff,
               uVar3 & 0xffffffff);
    }
  }
  else {
    snprintf((char *)&hours,0x80,"%dd %d:%02d:%02d",t / 0x15180 & 0xffffffff,uVar1 & 0xffffffff,
             uVar2 & 0xffffffff,local_b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&hours,&local_b9);
  std::allocator<char>::~allocator(&local_b9);
  return __return_storage_ptr__;
}

Assistant:

std::string Progress::formatTime (time_t t)
{
  char buffer [128];

  int days    =  t          / 86400;
  int hours   = (t % 86400) / 3600;
  int minutes = (t %  3600) / 60;
  int seconds =  t % 60;

  if (days)
    snprintf (buffer, 128, "%dd %d:%02d:%02d", days, hours, minutes, seconds);
  else if (hours)
    snprintf (buffer, 128,     "%d:%02d:%02d",       hours, minutes, seconds);
  else
    snprintf (buffer, 128,        "%02d:%02d",              minutes, seconds);

  return std::string (buffer);
}